

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_wnaf(secp256k1_scalar *number,int w)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  int v;
  int bits;
  int i;
  int zeroes;
  int wnaf [256];
  secp256k1_scalar t;
  secp256k1_scalar two;
  secp256k1_scalar x;
  undefined4 in_stack_fffffffffffffb68;
  uint in_stack_fffffffffffffb6c;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint local_478 [2];
  secp256k1_scalar *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  secp256k1_scalar *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  secp256k1_scalar *in_stack_fffffffffffffbb0;
  
  iVar5 = -1;
  secp256k1_scalar_set_int
            ((secp256k1_scalar *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             in_stack_fffffffffffffb6c);
  secp256k1_scalar_set_int
            ((secp256k1_scalar *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             in_stack_fffffffffffffb6c);
  iVar2 = secp256k1_ecmult_wnaf
                    ((int *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,
                     in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
  iVar4 = iVar2;
  if (0x100 < iVar2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1462,"test condition failed: bits <= 256");
    abort();
  }
  do {
    iVar4 = iVar4 + -1;
    if (iVar4 < 0) {
      iVar4 = secp256k1_scalar_eq((secp256k1_scalar *)
                                  CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                  (secp256k1_scalar *)
                                  CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
      if (iVar4 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1478,"test condition failed: secp256k1_scalar_eq(&x, number)");
        abort();
      }
      return;
    }
    uVar3 = local_478[iVar4];
    secp256k1_scalar_mul
              (in_stack_fffffffffffffbb0,
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0);
    if (uVar3 == 0) {
      if (iVar5 == -1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x146d,"test condition failed: zeroes != -1");
        abort();
      }
      iVar5 = iVar5 + 1;
    }
    else {
      bVar1 = in_ESI + -1 <= iVar5;
      in_stack_fffffffffffffb77 = iVar5 == -1 || bVar1;
      if (iVar5 != -1 && !bVar1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1467,"test condition failed: zeroes == -1 || zeroes >= w-1");
        abort();
      }
      iVar5 = 0;
      if ((uVar3 & 1) != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x1469,"test condition failed: (v & 1) == 1");
        abort();
      }
      if ((1 << ((char)in_ESI - 1U & 0x1f)) + -1 < (int)uVar3) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x146a,"test condition failed: v <= (1 << (w-1)) - 1");
        abort();
      }
      if ((int)uVar3 < -1 - (1 << ((char)in_ESI - 1U & 0x1f))) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
                ,0x146b,"test condition failed: v >= -(1 << (w-1)) - 1");
        abort();
      }
    }
    if ((int)uVar3 < 0) {
      secp256k1_scalar_set_int
                ((secp256k1_scalar *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb6c);
      secp256k1_scalar_negate
                ((secp256k1_scalar *)CONCAT44(iVar5,iVar4),(secp256k1_scalar *)CONCAT44(iVar2,uVar3)
                );
    }
    else {
      secp256k1_scalar_set_int
                ((secp256k1_scalar *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb6c);
    }
    secp256k1_scalar_add
              (in_stack_fffffffffffffba0,
               (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               in_stack_fffffffffffffb90);
  } while( true );
}

Assistant:

static void test_wnaf(const secp256k1_scalar *number, int w) {
    secp256k1_scalar x, two, t;
    int wnaf[256];
    int zeroes = -1;
    int i;
    int bits;
    secp256k1_scalar_set_int(&x, 0);
    secp256k1_scalar_set_int(&two, 2);
    bits = secp256k1_ecmult_wnaf(wnaf, 256, number, w);
    CHECK(bits <= 256);
    for (i = bits-1; i >= 0; i--) {
        int v = wnaf[i];
        secp256k1_scalar_mul(&x, &x, &two);
        if (v) {
            CHECK(zeroes == -1 || zeroes >= w-1); /* check that distance between non-zero elements is at least w-1 */
            zeroes=0;
            CHECK((v & 1) == 1); /* check non-zero elements are odd */
            CHECK(v <= (1 << (w-1)) - 1); /* check range below */
            CHECK(v >= -(1 << (w-1)) - 1); /* check range above */
        } else {
            CHECK(zeroes != -1); /* check that no unnecessary zero padding exists */
            zeroes++;
        }
        if (v >= 0) {
            secp256k1_scalar_set_int(&t, v);
        } else {
            secp256k1_scalar_set_int(&t, -v);
            secp256k1_scalar_negate(&t, &t);
        }
        secp256k1_scalar_add(&x, &x, &t);
    }
    CHECK(secp256k1_scalar_eq(&x, number)); /* check that wnaf represents number */
}